

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int ffgtch(fitsfile *gfptr,int grouptype,int *status)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int locationCol;
  int uriCol;
  int extverCol;
  int extnameCol;
  long tfields;
  int xtensionCol;
  int colnum;
  int positionCol;
  int ncols;
  int grptype;
  char *ttype [6];
  char *tform [6];
  char comment [73];
  char tformBuff [54];
  char keyvalue [71];
  char keyword [75];
  char ttypeBuff [102];
  
  ncols = 0;
  colnum = 0;
  grptype = 0;
  tfields = 0;
  if (*status != 0) {
    return *status;
  }
  pcVar2 = ttypeBuff;
  pcVar3 = tformBuff;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    ttype[lVar4] = pcVar2;
    tform[lVar4] = pcVar3;
    pcVar2 = pcVar2 + 0x11;
    pcVar3 = pcVar3 + 9;
  }
  iVar1 = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,&locationCol,&uriCol,
                 &grptype,status);
  *status = iVar1;
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = ffgkyj(gfptr,"TFIELDS",&tfields,comment,status);
  *status = iVar1;
  iVar1 = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,locationCol,uriCol,ttype,
                 tform,&ncols,status);
  *status = iVar1;
  switch(grouptype) {
  case 0:
    goto switchD_001acf12_caseD_0;
  case 1:
    if (positionCol != 0) {
      iVar1 = ffdcol(gfptr,positionCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      if (positionCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (positionCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (uriCol != 0) {
      iVar1 = ffdcol(gfptr,uriCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      if (uriCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (locationCol != 0) {
      iVar1 = ffdcol(gfptr,locationCol,status);
      *status = iVar1;
    }
    goto switchD_001acf12_caseD_0;
  case 2:
    if (xtensionCol != 0) {
      iVar1 = ffdcol(gfptr,xtensionCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      if (xtensionCol < extnameCol) {
        extnameCol = extnameCol + -1;
      }
      if (xtensionCol < extverCol) {
        extverCol = extverCol + -1;
      }
      if (xtensionCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (xtensionCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (extnameCol != 0) {
      iVar1 = ffdcol(gfptr,extnameCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      if (extnameCol < extverCol) {
        extverCol = extverCol + -1;
      }
      if (extnameCol < uriCol) {
        uriCol = uriCol + -1;
      }
      if (extnameCol < locationCol) {
        locationCol = locationCol + -1;
      }
    }
    if (extverCol == 0) goto switchD_001acf12_caseD_3;
    iVar1 = ffdcol(gfptr,extverCol,status);
    *status = iVar1;
    tfields = tfields + -1;
    if (extverCol < uriCol) {
      uriCol = uriCol + -1;
    }
    if (extverCol < locationCol) {
      locationCol = locationCol + -1;
    }
    goto LAB_001ad12a;
  case 3:
switchD_001acf12_caseD_3:
LAB_001ad12a:
    iVar1 = locationCol;
    if (uriCol != 0) {
      iVar1 = ffdcol(gfptr,uriCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      iVar1 = locationCol;
      if (uriCol < locationCol) {
        locationCol = locationCol + -1;
        iVar1 = locationCol;
      }
    }
    break;
  default:
    *status = 0x15b;
    ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
    goto switchD_001acf12_caseD_0;
  case 0xb:
    iVar1 = positionCol;
    break;
  case 0xc:
    if (xtensionCol != 0) {
      iVar1 = ffdcol(gfptr,xtensionCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      if (xtensionCol < extnameCol) {
        extnameCol = extnameCol + -1;
      }
      if (xtensionCol < extverCol) {
        extverCol = extverCol + -1;
      }
    }
    iVar1 = extverCol;
    if (extnameCol != 0) {
      iVar1 = ffdcol(gfptr,extnameCol,status);
      *status = iVar1;
      tfields = tfields + -1;
      iVar1 = extverCol;
      if (extnameCol < extverCol) {
        extverCol = extverCol + -1;
        iVar1 = extverCol;
      }
    }
  }
  if (iVar1 != 0) {
    iVar1 = ffdcol(gfptr,iVar1,status);
    *status = iVar1;
    tfields = tfields + -1;
  }
switchD_001acf12_caseD_0:
  uVar5 = 0;
  uVar6 = (ulong)(uint)ncols;
  if (ncols < 1) {
    uVar6 = uVar5;
  }
  while ((uVar6 != uVar5 && (*status == 0))) {
    iVar1 = fficol(gfptr,(int)uVar5 + (int)tfields + 1,ttype[uVar5],tform[uVar5],status);
    *status = iVar1;
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  do {
    if ((uVar6 == uVar5) || (*status != 0)) {
      return *status;
    }
    pcVar2 = ttype[uVar5];
    iVar1 = fits_strcasecmp(pcVar2,"MEMBER_POSITION");
    if ((iVar1 == 0) || (iVar1 = fits_strcasecmp(pcVar2,"MEMBER_VERSION"), iVar1 == 0)) {
      iVar1 = ffgcno(gfptr,1,pcVar2,&colnum,status);
      *status = iVar1;
      snprintf(keyword,0x4b,"TFORM%d",(ulong)(uint)colnum);
      iVar1 = ffgkys(gfptr,keyword,keyvalue,comment,status);
      *status = iVar1;
      snprintf(keyword,0x4b,"TNULL%d",(ulong)(uint)colnum);
      iVar1 = ffikyj(gfptr,keyword,0,"Column Null Value",status);
LAB_001ad2e0:
      *status = iVar1;
    }
    else {
      iVar1 = fits_strcasecmp(pcVar2,"MEMBER_XTENSION");
      if ((((iVar1 == 0) || (iVar1 = fits_strcasecmp(pcVar2,"MEMBER_NAME"), iVar1 == 0)) ||
          (iVar1 = fits_strcasecmp(pcVar2,"MEMBER_URI_TYPE"), iVar1 == 0)) ||
         (iVar1 = fits_strcasecmp(pcVar2,"MEMBER_LOCATION"), iVar1 == 0)) {
        iVar1 = ffgcno(gfptr,1,pcVar2,&colnum,status);
        goto LAB_001ad2e0;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int ffgtch(fitsfile *gfptr,     /* FITS pointer to group                     */
	   int       grouptype, /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */


/* 
   Change the grouping table structure of the grouping table pointed to by
   gfptr. The grouptype code specifies the new structure of the table. This
   operation only adds or removes grouping table columns, it does not add
   or delete group members (i.e., table rows). If the grouping table already
   has the desired structure then no operations are performed and function   
   simply returns with a (0) success status code. If the requested structure
   change creates new grouping table columns, then the column values for all
   existing members will be filled with the appropriate null values.
*/

{
  int xtensionCol, extnameCol, extverCol, positionCol, locationCol, uriCol;
  int ncols    = 0;
  int colnum   = 0;
  int nrows    = 0;
  int grptype  = 0;
  int i,j;

  long intNull  = 0;
  long tfields  = 0;
  
  char *tform[6];
  char *ttype[6];

  unsigned char  charNull[1] = {'\0'};

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];


  if(*status != 0) return(*status);

  do
    {
      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* retrieve positions of all Grouping table reserved columns */

      *status = ffgtgc(gfptr,&xtensionCol,&extnameCol,&extverCol,&positionCol,
		       &locationCol,&uriCol,&grptype,status);

      if(*status != 0) continue;

      /* determine the total number of grouping table columns */

      *status = fits_read_key_lng(gfptr,"TFIELDS",&tfields,comment,status);

      /* define grouping table columns to be added to the configuration */

      *status = ffgtdc(grouptype,xtensionCol,extnameCol,extverCol,positionCol,
		       locationCol,uriCol,ttype,tform,&ncols,status);

      /*
	delete any grouping tables columns that exist but do not belong to
	new desired configuration; note that we delete before creating new
	columns for (file size) efficiency reasons
      */

      switch(grouptype)
	{

	case GT_ID_ALL_URI:

	  /* no columns to be deleted in this case */

	  break;

	case GT_ID_REF:

	  if(positionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	      if(uriCol      > positionCol)  --uriCol;
	      if(locationCol > positionCol) --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	    *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol) --locationCol;
	    }
	  if(locationCol != 0) 
	    *status = fits_delete_col(gfptr,locationCol,status);

	  break;

	case  GT_ID_POS:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol  > xtensionCol)  --extnameCol;
	      if(extverCol   > xtensionCol)  --extverCol;
	      if(uriCol      > xtensionCol)  --uriCol;
	      if(locationCol > xtensionCol)  --locationCol;
	    }
	  if(extnameCol  != 0) 
	    {
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol   > extnameCol)  --extverCol;
	      if(uriCol      > extnameCol)  --uriCol;
	      if(locationCol > extnameCol)  --locationCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	      if(uriCol      > extverCol)  --uriCol;
	      if(locationCol > extverCol)  --locationCol;
	    }
	  if(uriCol      != 0)
	    { 
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }
	  
	  break;

	case  GT_ID_ALL:

	  if(uriCol      != 0) 
	    {
	      *status = fits_delete_col(gfptr,uriCol,status);
	      --tfields;
	      if(locationCol > uriCol)  --locationCol;
	    }
	  if(locationCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,locationCol,status);
	      --tfields;
	    }

	  break;

	case GT_ID_REF_URI:

	  if(positionCol != 0)
	    { 
	      *status = fits_delete_col(gfptr,positionCol,status);
	      --tfields;
	    }

	  break;

	case  GT_ID_POS_URI:

	  if(xtensionCol != 0) 
	    {
	      *status = fits_delete_col(gfptr,xtensionCol,status);
	      --tfields;
	      if(extnameCol > xtensionCol)  --extnameCol;
	      if(extverCol  > xtensionCol)  --extverCol;
	    }
	  if(extnameCol  != 0)
	    { 
	      *status = fits_delete_col(gfptr,extnameCol,status);
	      --tfields;
	      if(extverCol > extnameCol)  --extverCol;
	    }
	  if(extverCol   != 0)
	    { 
	      *status = fits_delete_col(gfptr,extverCol,status);
	      --tfields;
	    }

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value for grouptype parameter specified (ffgtch)");
	  break;

	}

      /*
	add all the new grouping table columns that were not there
	previously but are called for by the grouptype parameter
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	*status = fits_insert_col(gfptr,tfields+i+1,ttype[i],tform[i],status);

      /* 
	 add the TNULL keywords and values for each new integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns. Insert a null ("/0") into each new string
	 column defined: MEMBER_XTENSION, MEMBER_NAME, MEMBER_URI_TYPE and
	 MEMBER_LOCATION. Note that by convention a null string is the
	 TNULL value for character fields so no TNULL is required.
      */

      for(i = 0; i < ncols && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      /* col contains int data; set TNULL and insert 0 for each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",colnum);

	      *status = fits_read_key_str(gfptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",colnum);

	      *status = fits_insert_key_lng(gfptr,keyword,0,
					    "Column Null Value",status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
		*status = fits_write_col_lng(gfptr,colnum,j,1,1,&intNull,
					     status);
	    }
	  else if(fits_strcasecmp(ttype[i],"MEMBER_XTENSION") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_NAME")     == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_URI_TYPE") == 0 ||
		  fits_strcasecmp(ttype[i],"MEMBER_LOCATION") == 0)
	    {

	      /* new col contains character data; insert NULLs into each col */

	      *status = fits_get_colnum(gfptr,CASESEN,ttype[i],&colnum,
					status);

	      for(j = 1; j <= nrows && *status == 0; ++j)
	    /* WILL THIS WORK FOR VAR LENTH CHAR COLS??????*/
		*status = fits_write_col_byt(gfptr,colnum,j,1,1,charNull,
					     status);
	    }
	}

    }while(0);

  return(*status);
}